

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O3

Vec_Int_t * Gia_ManSwiSimulate(Gia_Man_t *pAig,Gia_ParSwi_t *pPars)

{
  Gia_Obj_t *pGVar1;
  size_t __n;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int nTotal;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Gia_ManSwi_t *p;
  ulong uVar12;
  Vec_Int_t *pVVar13;
  int *__s;
  uint uVar14;
  uint *pInfo;
  long lVar15;
  long lVar16;
  uint *puVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint *puVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  float fVar26;
  float fVar27;
  double dVar28;
  timespec ts;
  timespec local_60;
  int local_4c;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  iVar5 = clock_gettime(3,&local_60);
  if (iVar5 < 0) {
    local_38 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    local_38 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  if ((pPars->fProbOne != 0) && (pPars->fProbTrans != 0)) {
    puts(
        "Conflict of options: Can either compute probability of 1, or probability of switching by observing transitions."
        );
  }
  iVar5 = clock_gettime(3,&local_60);
  if (iVar5 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  p = Gia_ManSwiCreate(pAig,pPars);
  if (pPars->fVerbose != 0) {
    iVar5 = pAig->vCis->nSize;
    pGVar2 = p->pAig;
    printf("Obj = %8d (%8d). F = %6d. ",(ulong)(uint)pAig->nObjs,
           (ulong)(uint)(iVar5 + pAig->nObjs + ~(pAig->vCos->nSize + iVar5)),
           (ulong)(uint)pGVar2->nFront);
    dVar28 = (double)p->nWords * 4.0;
    iVar5 = 0x94872f;
    printf("AIG = %7.2f MB. F-mem = %7.2f MB. Other = %7.2f MB.  ",
           (double)pGVar2->nObjs * 12.0 * 9.5367431640625e-07,
           (double)pGVar2->nFront * dVar28 * 9.5367431640625e-07,
           (double)(pGVar2->vCos->nSize + pGVar2->vCis->nSize) * dVar28 * 9.5367431640625e-07);
    Abc_Print(iVar5,"%s =","Time");
    iVar19 = 3;
    iVar5 = clock_gettime(3,&local_60);
    if (iVar5 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    Abc_Print(iVar19,"%9.2f sec\n",(double)(lVar16 + lVar15) / 1000000.0);
  }
  Gia_ManRandom(1);
  pGVar2 = p->pAig;
  iVar5 = pGVar2->nRegs;
  pVVar13 = pGVar2->vCis;
  iVar19 = pVVar13->nSize;
  uVar25 = 0;
  if (iVar5 < iVar19) {
    uVar14 = p->nWords;
    puVar17 = p->pDataSimCis;
    uVar25 = 0;
    do {
      uVar18 = (ulong)uVar14 + 1;
      if (0 < (int)uVar14) {
        do {
          uVar6 = Gia_ManRandom(0);
          puVar17[uVar18 - 2] = uVar6;
          uVar18 = uVar18 - 1;
        } while (1 < uVar18);
        iVar5 = pGVar2->nRegs;
        pVVar13 = pGVar2->vCis;
      }
      uVar25 = uVar25 + 1;
      iVar19 = pVVar13->nSize;
      puVar17 = puVar17 + (int)uVar14;
    } while ((long)uVar25 < (long)(iVar19 - iVar5));
  }
  if ((int)uVar25 < iVar19) {
    iVar5 = p->nWords;
    __n = (long)iVar5 * 4;
    uVar25 = uVar25 & 0xffffffff;
    lVar15 = (long)iVar5 * uVar25 * 4;
    do {
      if (0 < iVar5) {
        memset((void *)((long)p->pDataSimCis + lVar15),0,__n);
        iVar19 = pVVar13->nSize;
      }
      uVar25 = uVar25 + 1;
      lVar15 = lVar15 + __n;
    } while ((long)uVar25 < (long)iVar19);
  }
  uVar25 = (ulong)(uint)pPars->nIters;
  if (0 < pPars->nIters) {
    local_48 = 0;
    do {
      if (pGVar2->nFront < 1) {
        __assert_fail("p->pAig->nFront > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                      ,0x1dd,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
      }
      pGVar3 = pGVar2->pObjs;
      if (pGVar3->Value != 0) {
        __assert_fail("Gia_ManConst0(p->pAig)->Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                      ,0x1de,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
      }
      iVar5 = pPars->nPref;
      puVar17 = p->pDataSim;
      uVar14 = p->nWords;
      lVar15 = (long)(int)uVar14;
      uVar18 = (ulong)uVar14;
      if (0 < lVar15) {
        memset(puVar17,0,uVar18 * 4);
      }
      if (1 < pGVar2->nObjs) {
        uVar25 = uVar18 + 1;
        lVar16 = 1;
        do {
          pGVar1 = pGVar3 + lVar16;
          uVar23 = *(ulong *)pGVar1;
          uVar6 = (uint)uVar23;
          uVar7 = (uint)(uVar23 >> 0x20);
          if ((int)uVar6 < 0) {
            uVar8 = pGVar1->Value;
            if ((~uVar6 & 0x1fffffff) == 0) {
              if (pGVar2->nFront <= (int)uVar8) {
                __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                              ,0x1ef,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
              }
              if (0 < (int)uVar14) {
                puVar21 = p->pDataSimCis;
                uVar23 = uVar25;
                do {
                  puVar17[(long)(int)(uVar8 * uVar14) + (uVar23 - 2)] =
                       puVar21[(long)(int)((uVar7 & 0x1fffffff) * uVar14) + (uVar23 - 2)];
                  uVar23 = uVar23 - 1;
                } while (1 < uVar23);
              }
            }
            else {
              if (uVar8 != 0x1fffffff) {
                __assert_fail("Gia_ObjValue(pObj) == GIA_NONE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                              ,0x1e9,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
              }
              iVar19 = (uVar7 & 0x1fffffff) * uVar14;
              iVar20 = (uVar6 & 0x1fffffff) * uVar14;
              puVar21 = p->pDataSimCos;
              if ((uVar6 >> 0x1d & 1) == 0) {
                uVar23 = uVar25;
                if (0 < (int)uVar14) {
                  do {
                    puVar21[(long)iVar19 + (uVar23 - 2)] = puVar17[(long)iVar20 + (uVar23 - 2)];
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
              }
              else {
                uVar23 = uVar25;
                if (0 < (int)uVar14) {
                  do {
                    puVar21[(long)iVar19 + (uVar23 - 2)] = ~puVar17[(long)iVar20 + (uVar23 - 2)];
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
              }
            }
          }
          else {
            if (pGVar2->nFront <= (int)pGVar1->Value) {
              __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                            ,0x1e4,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
            }
            iVar19 = pGVar1->Value * uVar14;
            iVar20 = (uVar6 & 0x1fffffff) * uVar14;
            iVar24 = (uVar7 & 0x1fffffff) * uVar14;
            if ((uVar6 >> 0x1d & 1) == 0) {
              if ((uVar23 >> 0x3d & 1) == 0) {
                uVar23 = uVar25;
                if (0 < (int)uVar14) {
                  do {
                    puVar17[(long)iVar19 + (uVar23 - 2)] =
                         puVar17[(long)iVar24 + (uVar23 - 2)] & puVar17[(long)iVar20 + (uVar23 - 2)]
                    ;
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
              }
              else {
                uVar23 = uVar25;
                if (0 < (int)uVar14) {
                  do {
                    puVar17[(long)iVar19 + (uVar23 - 2)] =
                         ~puVar17[(long)iVar24 + (uVar23 - 2)] &
                         puVar17[(long)iVar20 + (uVar23 - 2)];
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
              }
            }
            else if ((uVar23 >> 0x3d & 1) == 0) {
              uVar23 = uVar25;
              if (0 < (int)uVar14) {
                do {
                  puVar17[(long)iVar19 + (uVar23 - 2)] =
                       ~puVar17[(long)iVar20 + (uVar23 - 2)] & puVar17[(long)iVar24 + (uVar23 - 2)];
                  uVar23 = uVar23 - 1;
                } while (1 < uVar23);
              }
            }
            else {
              uVar23 = uVar25;
              if (0 < (int)uVar14) {
                do {
                  puVar17[(long)iVar19 + (uVar23 - 2)] =
                       ~(puVar17[(long)iVar24 + (uVar23 - 2)] | puVar17[(long)iVar20 + (uVar23 - 2)]
                        );
                  uVar23 = uVar23 - 1;
                } while (1 < uVar23);
              }
            }
          }
          if ((iVar5 <= (int)local_48) &&
             (-1 < (int)*(uint *)pGVar1 || (~*(uint *)pGVar1 & 0x1fffffff) == 0)) {
            iVar19 = pGVar1->Value * uVar14;
            if (p->pPars->fProbTrans == 0) {
              if ((int)uVar14 < 1) goto LAB_0022fe5e;
              iVar20 = 0;
              uVar23 = uVar25;
              do {
                uVar6 = (puVar17[(long)iVar19 + (uVar23 - 2)] >> 1 & 0x55555555) +
                        (puVar17[(long)iVar19 + (uVar23 - 2)] & 0x55555555);
                uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
                uVar6 = (uVar6 >> 4 & 0x7070707) + (uVar6 & 0x7070707);
                uVar6 = (uVar6 >> 8 & 0xf000f) + (uVar6 & 0xf000f);
                iVar20 = (uVar6 >> 0x10) + iVar20 + (uVar6 & 0xffff);
                uVar23 = uVar23 - 1;
              } while (1 < uVar23);
            }
            else if ((int)uVar14 < 1) {
LAB_0022fe5e:
              iVar20 = 0;
            }
            else {
              iVar20 = 0;
              uVar23 = uVar25;
              do {
                uVar6 = puVar17[(long)iVar19 + (uVar23 - 2)] >> 0x10 ^
                        puVar17[(long)iVar19 + (uVar23 - 2)];
                uVar6 = (uVar6 >> 1 & 0x5555) + (uVar6 & 0x5555);
                uVar6 = (uVar6 >> 2 & 0x3333) + (uVar6 & 0x3333);
                uVar6 = (uVar6 >> 4 & 0x707) + (uVar6 & 0x707);
                iVar20 = iVar20 + ((uVar6 >> 8) + (uVar6 & 0xff)) * 2;
                uVar23 = uVar23 - 1;
              } while (1 < uVar23);
            }
            p->pData1[lVar16] = p->pData1[lVar16] + iVar20;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < pGVar2->nObjs);
      }
      uVar25 = (ulong)(uint)pPars->nIters;
      if ((int)local_48 == pPars->nIters - 1U) break;
      iVar5 = pPars->nRandPiFactor;
      iVar19 = pGVar2->vCos->nSize;
      local_4c = iVar5;
      if (pPars->fProbTrans == 0) {
        uVar6 = pVVar13->nSize;
        uVar23 = 0;
        uVar25 = (ulong)uVar6;
        if (pGVar2->nRegs < (int)uVar6) {
          puVar17 = p->pDataSimCis;
          uVar12 = uVar18 + 1;
          uVar23 = 0;
          do {
            iVar5 = local_4c;
            if (local_4c == -1) {
              uVar7 = Gia_ManRandom(0);
              local_40 = CONCAT44(local_40._4_4_,uVar7);
              uVar7 = Gia_ManRandom(0);
              uVar8 = Gia_ManRandom(0);
              uVar9 = Gia_ManRandom(0);
              uVar10 = Gia_ManRandom(0);
              if (0 < (int)uVar14) {
                uVar25 = uVar12;
                do {
                  puVar17[uVar25 - 2] =
                       puVar17[uVar25 - 2] ^ (uVar9 & uVar8 & uVar10 | uVar7 & (uint)local_40);
                  uVar25 = uVar25 - 1;
                } while (1 < uVar25);
              }
            }
            else if (local_4c < 1) {
              if (local_4c != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                              ,0xac,
                              "void Gia_ManSwiSimInfoRandom(Gia_ManSwi_t *, unsigned int *, int)");
              }
              uVar25 = uVar12;
              if (0 < (int)uVar14) {
                do {
                  uVar7 = Gia_ManRandom(0);
                  puVar17[uVar25 - 2] = uVar7;
                  uVar25 = uVar25 - 1;
                } while (1 < uVar25);
              }
            }
            else {
              uVar7 = Gia_ManRandom(0);
              do {
                uVar8 = Gia_ManRandom(0);
                uVar7 = uVar7 & uVar8;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
              uVar25 = uVar12;
              if (0 < (int)uVar14) {
                do {
                  puVar17[uVar25 - 2] = puVar17[uVar25 - 2] ^ uVar7;
                  uVar25 = uVar25 - 1;
                } while (1 < uVar25);
              }
            }
            uVar23 = uVar23 + 1;
            pVVar13 = pGVar2->vCis;
            uVar25 = (ulong)pVVar13->nSize;
            puVar17 = puVar17 + lVar15;
          } while ((long)uVar23 < (long)(uVar25 - (long)pGVar2->nRegs));
        }
        if ((int)uVar23 < (int)uVar25) {
          uVar23 = uVar23 & 0xffffffff;
          puVar21 = (uint *)(lVar15 * 4 * uVar23 + (long)p->pDataSimCis);
          puVar17 = p->pDataSimCos + ((long)(int)(iVar19 - uVar6) + uVar23) * lVar15;
          do {
            uVar12 = uVar18 + 1;
            if (0 < (int)uVar14) {
              do {
                puVar21[uVar12 - 2] = puVar17[uVar12 - 2];
                uVar12 = uVar12 - 1;
              } while (1 < uVar12);
              uVar25 = (ulong)(uint)pVVar13->nSize;
            }
            uVar23 = uVar23 + 1;
            puVar21 = puVar21 + lVar15;
            puVar17 = puVar17 + lVar15;
          } while ((long)uVar23 < (long)(int)uVar25);
        }
      }
      else {
        uVar6 = pVVar13->nSize;
        uVar23 = 0;
        uVar25 = (ulong)uVar6;
        if (pGVar2->nRegs < (int)uVar6) {
          puVar17 = p->pDataSimCis;
          local_40 = uVar18 + 1;
          uVar23 = 0;
          do {
            if (iVar5 == -1) {
              uVar7 = Gia_ManRandom(0);
              uVar8 = Gia_ManRandom(0);
              uVar9 = Gia_ManRandom(0);
              uVar10 = Gia_ManRandom(0);
              uVar11 = Gia_ManRandom(0);
              uVar7 = uVar11 & uVar10 & uVar9 | uVar8 & uVar7;
              iVar5 = local_4c;
            }
            else {
              if (iVar5 < 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                              ,0xca,
                              "void Gia_ManSwiSimInfoRandomShift(Gia_ManSwi_t *, unsigned int *, int)"
                             );
              }
              uVar7 = Gia_ManRandom(0);
              for (iVar20 = iVar5; iVar20 != 0; iVar20 = iVar20 + -1) {
                uVar8 = Gia_ManRandom(0);
                uVar7 = uVar7 & uVar8;
              }
            }
            uVar25 = local_40;
            if (0 < (int)uVar14) {
              do {
                puVar17[uVar25 - 2] =
                     (puVar17[uVar25 - 2] ^ uVar7) & 0xffff | puVar17[uVar25 - 2] << 0x10;
                uVar25 = uVar25 - 1;
              } while (1 < uVar25);
            }
            uVar23 = uVar23 + 1;
            pVVar13 = pGVar2->vCis;
            uVar25 = (ulong)pVVar13->nSize;
            puVar17 = puVar17 + lVar15;
          } while ((long)uVar23 < (long)(uVar25 - (long)pGVar2->nRegs));
        }
        if ((int)uVar23 < (int)uVar25) {
          uVar23 = uVar23 & 0xffffffff;
          puVar17 = p->pDataSimCos + ((long)(int)(iVar19 - uVar6) + uVar23) * lVar15;
          puVar21 = (uint *)(lVar15 * 4 * uVar23 + (long)p->pDataSimCis);
          do {
            uVar12 = uVar18 + 1;
            if (0 < (int)uVar14) {
              do {
                puVar21[uVar12 - 2] =
                     (uint)(ushort)puVar17[uVar12 - 2] | puVar21[uVar12 - 2] << 0x10;
                uVar12 = uVar12 - 1;
              } while (1 < uVar12);
              uVar25 = (ulong)(uint)pVVar13->nSize;
            }
            uVar23 = uVar23 + 1;
            puVar17 = puVar17 + lVar15;
            puVar21 = puVar21 + lVar15;
          } while ((long)uVar23 < (long)(int)uVar25);
        }
      }
      uVar14 = (int)local_48 + 1;
      local_48 = (ulong)uVar14;
      uVar25 = (ulong)(uint)pPars->nIters;
    } while ((int)uVar14 < pPars->nIters);
  }
  if (pPars->fVerbose != 0) {
    iVar5 = 0x948765;
    printf("Simulated %d frames with %d words. ",uVar25,(ulong)(uint)pPars->nWords);
    Abc_Print(iVar5,"%s =","Simulation time");
    iVar19 = 3;
    iVar5 = clock_gettime(3,&local_60);
    if (iVar5 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    Abc_Print(iVar19,"%9.2f sec\n",(double)(lVar15 + local_38) / 1000000.0);
  }
  uVar14 = pAig->nObjs;
  uVar25 = (ulong)uVar14;
  pVVar13 = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar14 - 1) {
    uVar6 = uVar14;
  }
  pVVar13->nCap = uVar6;
  if (uVar6 == 0) {
    pVVar13->pArray = (int *)0x0;
    pVVar13->nSize = uVar14;
  }
  else {
    __s = (int *)malloc((long)(int)uVar6 << 2);
    pVVar13->pArray = __s;
    pVVar13->nSize = uVar14;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)uVar14 << 2);
      goto LAB_0023030d;
    }
  }
  __s = (int *)0x0;
LAB_0023030d:
  if (pPars->fProbOne == 0) {
    if (pPars->fProbTrans == 0) {
      if ((0 < (int)uVar14) && (pAig->pObjs != (Gia_Obj_t *)0x0)) {
        piVar4 = p->pData1;
        iVar5 = (pPars->nIters - pPars->nPref) * pPars->nWords * 0x20;
        fVar26 = (float)iVar5;
        uVar18 = 0;
        do {
          fVar27 = (float)piVar4[uVar18];
          __s[uVar18] = (int)(((float)(iVar5 - piVar4[uVar18]) * ((fVar27 + fVar27) / fVar26)) /
                             fVar26);
          uVar18 = uVar18 + 1;
        } while (uVar25 != uVar18);
      }
    }
    else if ((0 < (int)uVar14) && (pAig->pObjs != (Gia_Obj_t *)0x0)) {
      iVar5 = pPars->nIters;
      iVar19 = pPars->nPref;
      piVar4 = p->pData1;
      iVar20 = pPars->nWords;
      uVar18 = 0;
      do {
        __s[uVar18] = (int)((float)piVar4[uVar18] / (float)((iVar5 - iVar19) * iVar20 * 0x20));
        uVar18 = uVar18 + 1;
      } while (uVar25 != uVar18);
    }
  }
  else {
    if ((0 < (int)uVar14) && (pAig->pObjs != (Gia_Obj_t *)0x0)) {
      iVar5 = pPars->nIters;
      iVar19 = pPars->nPref;
      piVar4 = p->pData1;
      iVar20 = pPars->nWords;
      uVar18 = 0;
      do {
        __s[uVar18] = (int)((float)piVar4[uVar18] / (float)((iVar5 - iVar19) * iVar20 * 0x20));
        uVar18 = uVar18 + 1;
      } while (uVar25 != uVar18);
    }
    lVar15 = (long)pAig->vCos->nSize;
    if (0 < lVar15) {
      piVar4 = pAig->vCos->pArray;
      lVar16 = 0;
      do {
        iVar5 = piVar4[lVar16];
        lVar22 = (long)iVar5;
        if ((lVar22 < 0) || ((int)uVar14 <= iVar5)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar3 = pAig->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        uVar6 = (uint)*(undefined8 *)(pGVar3 + lVar22);
        pGVar1 = pGVar3 + lVar22 + -(ulong)(uVar6 & 0x1fffffff);
        if ((uVar6 >> 0x1d & 1) == 0) {
          if (pGVar3 + uVar25 <= pGVar1 || pGVar1 < pGVar3) {
LAB_00230616:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          fVar26 = (float)__s[(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555];
        }
        else {
          if (pGVar3 + uVar25 <= pGVar1 || pGVar1 < pGVar3) goto LAB_00230616;
          fVar26 = 1.0 - (float)__s[(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555];
        }
        __s[lVar22] = (int)fVar26;
        lVar16 = lVar16 + 1;
      } while (lVar15 != lVar16);
    }
  }
  Gia_ManSwiDelete(p);
  return pVVar13;
}

Assistant:

Vec_Int_t * Gia_ManSwiSimulate( Gia_Man_t * pAig, Gia_ParSwi_t * pPars )
{
    Gia_ManSwi_t * p;
    Gia_Obj_t * pObj;
    Vec_Int_t * vSwitching;
    float * pSwitching;
    int i;
    abctime clk, clkTotal = Abc_Clock();
    if ( pPars->fProbOne && pPars->fProbTrans )
        printf( "Conflict of options: Can either compute probability of 1, or probability of switching by observing transitions.\n" );
    // create manager
    clk = Abc_Clock();
    p = Gia_ManSwiCreate( pAig, pPars );
    if ( pPars->fVerbose )
    {
        printf( "Obj = %8d (%8d). F = %6d. ", 
            pAig->nObjs, Gia_ManCiNum(pAig) + Gia_ManAndNum(pAig), p->pAig->nFront );
        printf( "AIG = %7.2f MB. F-mem = %7.2f MB. Other = %7.2f MB.  ", 
            12.0*Gia_ManObjNum(p->pAig)/(1<<20), 
            4.0*p->nWords*p->pAig->nFront/(1<<20), 
            4.0*p->nWords*(Gia_ManCiNum(p->pAig) + Gia_ManCoNum(p->pAig))/(1<<20) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    // perform simulation
    Gia_ManRandom( 1 );
    Gia_ManSwiSimInfoInit( p );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_ManSwiSimulateRound( p, i >= pPars->nPref );
        if ( i == pPars->nIters - 1 )
            break;
        if ( pPars->fProbTrans )
            Gia_ManSwiSimInfoTransferShift( p, pPars->nRandPiFactor );
        else
            Gia_ManSwiSimInfoTransfer( p, pPars->nRandPiFactor );
    }
    if ( pPars->fVerbose )
    {
        printf( "Simulated %d frames with %d words. ", pPars->nIters, pPars->nWords );
        ABC_PRT( "Simulation time", Abc_Clock() - clkTotal );
    }
    // derive the result
    vSwitching = Vec_IntStart( Gia_ManObjNum(pAig) );
    pSwitching = (float *)vSwitching->pArray;
    if ( pPars->fProbOne )
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeProbOne( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
        Gia_ManForEachCo( pAig, pObj, i )
        {
            if ( Gia_ObjFaninC0(pObj) )
                pSwitching[Gia_ObjId(pAig,pObj)] = (float)1.0-pSwitching[Gia_ObjId(pAig,Gia_ObjFanin0(pObj))];
            else
                pSwitching[Gia_ObjId(pAig,pObj)] = pSwitching[Gia_ObjId(pAig,Gia_ObjFanin0(pObj))];
        }
    }
    else if ( pPars->fProbTrans )
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeProbOne( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
    }
    else
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeSwitching( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
    }
/*
    printf( "PI: " );
    Gia_ManForEachPi( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "LO: " );
    Gia_ManForEachRo( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "PO: " );
    Gia_ManForEachPo( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "LI: " );
    Gia_ManForEachRi( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );
*/
    Gia_ManSwiDelete( p );
    return vSwitching;

}